

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *this,iterator it,SnapshotDataType *t)

{
  pointer *ppSVar1;
  iterator __position;
  iterator __position_00;
  ulong uVar2;
  iterator iVar3;
  ulong local_18;
  
  local_18 = it.Position;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar2 != ((long)(this->Data).
                      super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).
                      super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0xb4,
                  "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(iterator, T &&) [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  if (local_18 <= uVar2) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    __position_00._M_current =
         (this->Data).
         super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->Data).
        super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
      ::_M_realloc_insert<cmStateDetail::SnapshotDataType>(&this->Data,__position_00,t);
    }
    else {
      memcpy(__position_00._M_current,t,0xd0);
      ppSVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    iVar3.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar3.Tree = this;
    return iVar3;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,0xb5,
                "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(iterator, T &&) [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }